

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cpp
# Opt level: O0

size_t fs_cpu_arch(char *arch,size_t buffer_size)

{
  size_type sVar1;
  string local_48 [32];
  string_view local_28;
  size_t local_18;
  size_t buffer_size_local;
  char *arch_local;
  
  local_18 = buffer_size;
  buffer_size_local = (size_t)arch;
  fs_cpu_arch_abi_cxx11_();
  local_28 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_48);
  sVar1 = fs_str2char(local_28,(char *)buffer_size_local,local_18);
  std::__cxx11::string::~string(local_48);
  return sVar1;
}

Assistant:

size_t fs_cpu_arch(char* arch, const size_t buffer_size)
{
  return fs_str2char(fs_cpu_arch(), arch, buffer_size);
}